

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerUsageHandler::begin_function_scope
          (CombinedImageSamplerUsageHandler *this,uint32_t *args,uint32_t length)

{
  SPIRFunction *pSVar1;
  long lVar2;
  uint32_t *puVar3;
  
  if (2 < length) {
    pSVar1 = get<spirv_cross::SPIRFunction>(this->compiler,args[2]);
    puVar3 = args + 3;
    for (lVar2 = 0; (ulong)(length - 3) * 5 != lVar2; lVar2 = lVar2 + 5) {
      add_dependency(this,(&((pSVar1->arguments).
                             super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr)->id)[lVar2]
                          .id,*puVar3);
      puVar3 = puVar3 + 1;
    }
  }
  return 2 < length;
}

Assistant:

bool Compiler::CombinedImageSamplerUsageHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &func = compiler.get<SPIRFunction>(args[2]);
	const auto *arg = &args[3];
	length -= 3;

	for (uint32_t i = 0; i < length; i++)
	{
		auto &argument = func.arguments[i];
		add_dependency(argument.id, arg[i]);
	}

	return true;
}